

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O3

Error __thiscall asmjit::BaseAssembler::embed(BaseAssembler *this,void *data,size_t dataSize)

{
  CodeHolder *this_00;
  Logger *this_01;
  Section *pSVar1;
  ulong uVar2;
  Error extraout_EAX;
  Error EVar3;
  ulong uVar4;
  uint8_t *__dest;
  
  this_00 = (this->super_BaseEmitter)._code;
  if (this_00 == (CodeHolder *)0x0) {
    EVar3 = BaseEmitter::reportError(&this->super_BaseEmitter,5,(char *)0x0);
    return EVar3;
  }
  EVar3 = 0;
  if (dataSize != 0) {
    __dest = this->_bufferPtr;
    if ((ulong)((long)this->_bufferEnd - (long)__dest) < dataSize) {
      EVar3 = CodeHolder::growBuffer(this_00,&this->_section->_buffer,dataSize);
      if (EVar3 != 0) goto LAB_00111160;
      __dest = this->_bufferPtr;
    }
    do {
      memcpy(__dest,data,dataSize);
      __dest = __dest + dataSize;
      this_01 = (this->super_BaseEmitter)._logger;
      if (this_01 != (Logger *)0x0) {
        Logger::logBinary(this_01,data,dataSize);
      }
      pSVar1 = this->_section;
      uVar4 = (long)__dest - (long)this->_bufferData;
      if (uVar4 <= (pSVar1->_buffer)._capacity) {
        this->_bufferPtr = __dest;
        uVar2 = (pSVar1->_buffer)._size;
        if (uVar4 < uVar2) {
          uVar4 = uVar2;
        }
        (pSVar1->_buffer)._size = uVar4;
        return 0;
      }
      embed();
      EVar3 = extraout_EAX;
LAB_00111160:
      EVar3 = BaseEmitter::reportError(&this->super_BaseEmitter,EVar3,(char *)0x0);
    } while (EVar3 == 0);
  }
  return EVar3;
}

Assistant:

Error BaseAssembler::embed(const void* data, size_t dataSize) {
  if (ASMJIT_UNLIKELY(!_code))
    return reportError(DebugUtils::errored(kErrorNotInitialized));

  if (dataSize == 0)
    return kErrorOk;

  CodeWriter writer(this);
  ASMJIT_PROPAGATE(writer.ensureSpace(this, dataSize));

  writer.emitData(data, dataSize);

#ifndef ASMJIT_NO_LOGGING
  if (_logger)
    _logger->logBinary(data, dataSize);
#endif

  writer.done(this);
  return kErrorOk;
}